

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.h
# Opt level: O0

Stats * __thiscall SimpleStrategy::Stats::operator+=(Stats *this,Stats *stats)

{
  Stats *stats_local;
  Stats *this_local;
  
  this->cfgs = stats->cfgs + this->cfgs;
  this->instrs = stats->instrs + this->instrs;
  this->blocks = stats->blocks + this->blocks;
  this->phantoms = stats->phantoms + this->phantoms;
  this->edges = stats->edges + this->edges;
  this->calls = stats->calls + this->calls;
  this->indirects = stats->indirects + this->indirects;
  return this;
}

Assistant:

Stats& operator+=(const Stats& stats) {
			cfgs += stats.cfgs;
			instrs += stats.instrs;
			blocks += stats.blocks;
			phantoms += stats.phantoms;
			edges += stats.edges;
			calls += stats.calls;
			indirects += stats.indirects;

			return *this;
		}